

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

bool __thiscall AActor::IsInsideVisibleAngles(AActor *this)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  bool local_f1;
  TAngle<double> local_e8;
  TAngle<double> local_e0;
  TAngle<double> local_d8;
  TFlags<ActorRenderFlag,_unsigned_int> local_cc;
  TVector3<double> local_c8;
  TAngle<double> local_b0;
  TFlags<ActorRenderFlag,_unsigned_int> local_a4;
  undefined1 local_a0 [8];
  DAngle to;
  undefined1 local_80 [8];
  DVector3 diffang;
  AActor *mo;
  DAngle temp_1;
  TAngle<double> local_50;
  DAngle temp;
  TAngle<double> local_40;
  DAngle pitchend;
  DAngle pitchstart;
  DAngle angleend;
  DAngle anglestart;
  AActor *this_local;
  
  iVar1 = (int)this;
  TFlags<ActorRenderFlag,_unsigned_int>::operator&
            ((TFlags<ActorRenderFlag,_unsigned_int> *)((long)&anglestart.Degrees + 4),iVar1 + 0x10c)
  ;
  uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&anglestart.Degrees + 4));
  if (uVar3 == 0) {
    this_local._7_1_ = true;
  }
  else {
    bVar2 = TObjPtr<AActor>::operator==
                      ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0),
                       (AActor *)0x0);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      TAngle<double>::TAngle(&angleend,&this->VisibleStartAngle);
      TAngle<double>::TAngle(&pitchstart,&this->VisibleEndAngle);
      TAngle<double>::TAngle(&pitchend,&this->VisibleStartPitch);
      TAngle<double>::TAngle(&local_40,&this->VisibleEndPitch);
      TAngle<double>::TAngle(&temp,&pitchstart);
      bVar2 = TAngle<double>::operator>(&angleend,&temp);
      if (bVar2) {
        TAngle<double>::TAngle(&local_50,&angleend);
        TAngle<double>::operator=(&angleend,&pitchstart);
        TAngle<double>::operator=(&pitchstart,&local_50);
      }
      TAngle<double>::TAngle(&temp_1,&local_40);
      bVar2 = TAngle<double>::operator>(&pitchend,&temp_1);
      if (bVar2) {
        TAngle<double>::TAngle((TAngle<double> *)&mo,&pitchend);
        TAngle<double>::operator=(&pitchend,&local_40);
        TAngle<double>::operator=(&local_40,(TAngle<double> *)&mo);
      }
      diffang.Z = (double)::TObjPtr::operator_cast_to_AActor_
                                    ((TObjPtr *)(&DAT_01ae7238 + (long)consoleplayer * 0x2a0));
      if ((AActor *)diffang.Z == (AActor *)0x0) {
        this_local._7_1_ = true;
      }
      else {
        Pos((DVector3 *)&to,this);
        TVector3<double>::operator-((TVector3<double> *)local_80,&ViewPos,(TVector3<double> *)&to);
        TVector3<double>::Angle((TVector3<double> *)local_a0);
        TFlags<ActorRenderFlag,_unsigned_int>::operator&(&local_a4,iVar1 + 0x10c);
        uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_a4);
        if (uVar3 == 0) {
          deltaangle<double>(&local_b0,&(this->Angles).Yaw);
          TAngle<double>::operator=((TAngle<double> *)local_a0,&local_b0);
        }
        TAngle<double>::TAngle((TAngle<double> *)&local_c8.Z,&angleend);
        bVar2 = TAngle<double>::operator>=((TAngle<double> *)local_a0,(TAngle<double> *)&local_c8.Z)
        ;
        if (bVar2) {
          TAngle<double>::TAngle((TAngle<double> *)&local_c8.Y,&pitchstart);
          bVar2 = TAngle<double>::operator<=
                            ((TAngle<double> *)local_a0,(TAngle<double> *)&local_c8.Y);
          if (bVar2) {
            TVector3<double>::Pitch(&local_c8);
            TAngle<double>::operator=((TAngle<double> *)local_a0,(TAngle<double> *)&local_c8);
            TFlags<ActorRenderFlag,_unsigned_int>::operator&(&local_cc,iVar1 + 0x10c);
            uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_cc);
            if (uVar3 == 0) {
              deltaangle<double>(&local_d8,&(this->Angles).Pitch);
              TAngle<double>::operator=((TAngle<double> *)local_a0,&local_d8);
            }
            TAngle<double>::TAngle(&local_e0,&pitchend);
            bVar2 = TAngle<double>::operator>=((TAngle<double> *)local_a0,&local_e0);
            local_f1 = false;
            if (bVar2) {
              TAngle<double>::TAngle(&local_e8,&local_40);
              local_f1 = TAngle<double>::operator<=((TAngle<double> *)local_a0,&local_e8);
            }
            return local_f1;
          }
        }
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AActor::IsInsideVisibleAngles() const
{
	// Don't bother masking if not wanted.
	if (!(renderflags & RF_MASKROTATION))
		return true;

	if (players[consoleplayer].camera == nullptr)
		return true;
	
	DAngle anglestart = VisibleStartAngle;
	DAngle angleend = VisibleEndAngle;
	DAngle pitchstart = VisibleStartPitch;
	DAngle pitchend = VisibleEndPitch;
	
	if (anglestart > angleend)
	{
		DAngle temp = anglestart;
		anglestart = angleend;
		angleend = temp;
	}

	if (pitchstart > pitchend)
	{
		DAngle temp = pitchstart;
		pitchstart = pitchend;
		pitchend = temp;
	}
	

	AActor *mo = players[consoleplayer].camera;

	if (mo != nullptr)
	{
		
		DVector3 diffang = ViewPos - Pos();
		DAngle to = diffang.Angle();

		if (!(renderflags & RF_ABSMASKANGLE)) 
			to = deltaangle(Angles.Yaw, to);

		if ((to >= anglestart && to <= angleend))
		{
			to = diffang.Pitch();
			if (!(renderflags & RF_ABSMASKPITCH))
				to = deltaangle(Angles.Pitch, to);

			return !!(to >= pitchstart && to <= pitchend);
		}
		else return false;
	}
	return true;
}